

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Eltwise_x86_avx::forward
          (Eltwise_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  Mat *m;
  Mat *this_00;
  _func_int **pp_Var4;
  float fVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  ulong uVar8;
  uint uVar9;
  float *pfVar10;
  pointer pMVar11;
  float *pfVar12;
  ulong uVar13;
  undefined1 (*pauVar14) [32];
  undefined1 (*pauVar15) [32];
  int iVar16;
  long lVar17;
  undefined1 (*pauVar18) [32];
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar31 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  uVar3 = m->c;
  uVar21 = (ulong)uVar3;
  uVar9 = m->h * m->w * m->elempack;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  iVar16 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx[-3]) == 0) {
      if (0 < (int)uVar3) {
        pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar8 = 0;
        do {
          pfVar10 = (float *)(m->cstep * uVar8 * m->elemsize + (long)m->data);
          pfVar12 = (float *)(pMVar11[1].cstep * uVar8 * pMVar11[1].elemsize + (long)pMVar11[1].data
                             );
          pauVar14 = (undefined1 (*) [32])
                     (this_00->cstep * uVar8 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar9 < 8) {
            uVar20 = 0;
          }
          else {
            iVar16 = 7;
            do {
              auVar6._4_4_ = pfVar12[1] * pfVar10[1];
              auVar6._0_4_ = *pfVar12 * *pfVar10;
              auVar6._8_4_ = pfVar12[2] * pfVar10[2];
              auVar6._12_4_ = pfVar12[3] * pfVar10[3];
              auVar6._16_4_ = pfVar12[4] * pfVar10[4];
              auVar6._20_4_ = pfVar12[5] * pfVar10[5];
              auVar6._24_4_ = pfVar12[6] * pfVar10[6];
              auVar6._28_4_ = pfVar12[7];
              *pauVar14 = auVar6;
              pfVar10 = pfVar10 + 8;
              pfVar12 = pfVar12 + 8;
              pauVar14 = pauVar14 + 1;
              iVar16 = iVar16 + 8;
              uVar20 = uVar9 & 0xfffffff8;
            } while (iVar16 < (int)uVar9);
          }
          uVar19 = uVar20 | 3;
          while ((int)uVar19 < (int)uVar9) {
            auVar22._0_4_ = *pfVar12 * *pfVar10;
            auVar22._4_4_ = pfVar12[1] * pfVar10[1];
            auVar22._8_4_ = pfVar12[2] * pfVar10[2];
            auVar22._12_4_ = pfVar12[3] * pfVar10[3];
            *(undefined1 (*) [16])*pauVar14 = auVar22;
            pfVar10 = pfVar10 + 4;
            pfVar12 = pfVar12 + 4;
            pauVar14 = (undefined1 (*) [32])((long)*pauVar14 + 0x10);
            uVar19 = uVar20 + 7;
            uVar20 = uVar20 + 4;
          }
          if (uVar9 - uVar20 != 0 && (int)uVar20 <= (int)uVar9) {
            lVar17 = 0;
            do {
              *(float *)((long)*pauVar14 + lVar17 * 4) = pfVar12[lVar17] * pfVar10[lVar17];
              lVar17 = lVar17 + 1;
            } while (uVar9 - uVar20 != (int)lVar17);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar21);
      }
      pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (2 < (ulong)(((long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                     -0x71c71c71c71c71c7)) {
        uVar8 = 2;
        do {
          if (0 < (int)uVar3) {
            pMVar11 = pMVar11 + uVar8;
            uVar13 = 0;
            do {
              pfVar10 = (float *)(pMVar11->cstep * uVar13 * pMVar11->elemsize + (long)pMVar11->data)
              ;
              pauVar14 = (undefined1 (*) [32])
                         (this_00->cstep * uVar13 * this_00->elemsize + (long)this_00->data);
              uVar20 = 0;
              if (7 < (int)uVar9) {
                iVar16 = 7;
                do {
                  auVar7._4_4_ = pfVar10[1] * *(float *)((long)*pauVar14 + 4);
                  auVar7._0_4_ = *pfVar10 * *(float *)*pauVar14;
                  auVar7._8_4_ = pfVar10[2] * *(float *)((long)*pauVar14 + 8);
                  auVar7._12_4_ = pfVar10[3] * *(float *)((long)*pauVar14 + 0xc);
                  auVar7._16_4_ = pfVar10[4] * *(float *)((long)*pauVar14 + 0x10);
                  auVar7._20_4_ = pfVar10[5] * *(float *)((long)*pauVar14 + 0x14);
                  auVar7._24_4_ = pfVar10[6] * *(float *)((long)*pauVar14 + 0x18);
                  auVar7._28_4_ = pfVar10[7];
                  *pauVar14 = auVar7;
                  pfVar10 = pfVar10 + 8;
                  pauVar14 = pauVar14 + 1;
                  iVar16 = iVar16 + 8;
                  uVar20 = uVar9 & 0xfffffff8;
                } while (iVar16 < (int)uVar9);
              }
              uVar19 = uVar20 | 3;
              while ((int)uVar19 < (int)uVar9) {
                auVar23._0_4_ = *pfVar10 * *(float *)*pauVar14;
                auVar23._4_4_ = pfVar10[1] * *(float *)((long)*pauVar14 + 4);
                auVar23._8_4_ = pfVar10[2] * *(float *)((long)*pauVar14 + 8);
                auVar23._12_4_ = pfVar10[3] * *(float *)((long)*pauVar14 + 0xc);
                *(undefined1 (*) [16])*pauVar14 = auVar23;
                pfVar10 = pfVar10 + 4;
                pauVar14 = (undefined1 (*) [32])((long)*pauVar14 + 0x10);
                uVar19 = uVar20 + 7;
                uVar20 = uVar20 + 4;
              }
              if (uVar9 - uVar20 != 0 && (int)uVar20 <= (int)uVar9) {
                lVar17 = 0;
                do {
                  *(float *)((long)*pauVar14 + lVar17 * 4) =
                       *(float *)((long)*pauVar14 + lVar17 * 4) * pfVar10[lVar17];
                  lVar17 = lVar17 + 1;
                } while (uVar9 - uVar20 != (int)lVar17);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar21);
          }
          uVar8 = uVar8 + 1;
          pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar8 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >>
                                 3) * -0x71c71c71c71c71c7));
      }
    }
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx[-3]) == 1) {
      pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (*(int *)(&this->field_0x104 + (long)this->_vptr_Eltwise_x86_avx[-3]) == 0) {
        if (0 < (int)uVar3) {
          uVar8 = 0;
          do {
            pfVar10 = (float *)(m->cstep * uVar8 * m->elemsize + (long)m->data);
            pfVar12 = (float *)(pMVar11[1].cstep * uVar8 * pMVar11[1].elemsize +
                               (long)pMVar11[1].data);
            pauVar14 = (undefined1 (*) [32])
                       (this_00->cstep * uVar8 * this_00->elemsize + (long)this_00->data);
            if ((int)uVar9 < 8) {
              uVar20 = 0;
            }
            else {
              iVar16 = 7;
              do {
                auVar28._0_4_ = *pfVar12 + *pfVar10;
                auVar28._4_4_ = pfVar12[1] + pfVar10[1];
                auVar28._8_4_ = pfVar12[2] + pfVar10[2];
                auVar28._12_4_ = pfVar12[3] + pfVar10[3];
                auVar28._16_4_ = pfVar12[4] + pfVar10[4];
                auVar28._20_4_ = pfVar12[5] + pfVar10[5];
                auVar28._24_4_ = pfVar12[6] + pfVar10[6];
                auVar28._28_4_ = pfVar12[7] + pfVar10[7];
                *pauVar14 = auVar28;
                pfVar10 = pfVar10 + 8;
                pfVar12 = pfVar12 + 8;
                pauVar14 = pauVar14 + 1;
                iVar16 = iVar16 + 8;
                uVar20 = uVar9 & 0xfffffff8;
              } while (iVar16 < (int)uVar9);
            }
            uVar19 = uVar20 | 3;
            while ((int)uVar19 < (int)uVar9) {
              auVar26._0_4_ = *pfVar12 + *pfVar10;
              auVar26._4_4_ = pfVar12[1] + pfVar10[1];
              auVar26._8_4_ = pfVar12[2] + pfVar10[2];
              auVar26._12_4_ = pfVar12[3] + pfVar10[3];
              *(undefined1 (*) [16])*pauVar14 = auVar26;
              pfVar10 = pfVar10 + 4;
              pfVar12 = pfVar12 + 4;
              pauVar14 = (undefined1 (*) [32])((long)*pauVar14 + 0x10);
              uVar19 = uVar20 + 7;
              uVar20 = uVar20 + 4;
            }
            if (uVar9 - uVar20 != 0 && (int)uVar20 <= (int)uVar9) {
              lVar17 = 0;
              do {
                *(float *)((long)*pauVar14 + lVar17 * 4) = pfVar12[lVar17] + pfVar10[lVar17];
                lVar17 = lVar17 + 1;
              } while (uVar9 - uVar20 != (int)lVar17);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar21);
        }
        pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                       -0x71c71c71c71c71c7)) {
          uVar8 = 2;
          do {
            if (0 < (int)uVar3) {
              pMVar11 = pMVar11 + uVar8;
              uVar13 = 0;
              do {
                pfVar10 = (float *)(pMVar11->cstep * uVar13 * pMVar11->elemsize +
                                   (long)pMVar11->data);
                pauVar14 = (undefined1 (*) [32])
                           (this_00->cstep * uVar13 * this_00->elemsize + (long)this_00->data);
                uVar20 = 0;
                if (7 < (int)uVar9) {
                  iVar16 = 7;
                  do {
                    auVar29._0_4_ = *pfVar10 + *(float *)*pauVar14;
                    auVar29._4_4_ = pfVar10[1] + *(float *)((long)*pauVar14 + 4);
                    auVar29._8_4_ = pfVar10[2] + *(float *)((long)*pauVar14 + 8);
                    auVar29._12_4_ = pfVar10[3] + *(float *)((long)*pauVar14 + 0xc);
                    auVar29._16_4_ = pfVar10[4] + *(float *)((long)*pauVar14 + 0x10);
                    auVar29._20_4_ = pfVar10[5] + *(float *)((long)*pauVar14 + 0x14);
                    auVar29._24_4_ = pfVar10[6] + *(float *)((long)*pauVar14 + 0x18);
                    auVar29._28_4_ = pfVar10[7] + *(float *)((long)*pauVar14 + 0x1c);
                    *pauVar14 = auVar29;
                    pfVar10 = pfVar10 + 8;
                    pauVar14 = pauVar14 + 1;
                    iVar16 = iVar16 + 8;
                    uVar20 = uVar9 & 0xfffffff8;
                  } while (iVar16 < (int)uVar9);
                }
                uVar19 = uVar20 | 3;
                while ((int)uVar19 < (int)uVar9) {
                  auVar27._0_4_ = *pfVar10 + *(float *)*pauVar14;
                  auVar27._4_4_ = pfVar10[1] + *(float *)((long)*pauVar14 + 4);
                  auVar27._8_4_ = pfVar10[2] + *(float *)((long)*pauVar14 + 8);
                  auVar27._12_4_ = pfVar10[3] + *(float *)((long)*pauVar14 + 0xc);
                  *(undefined1 (*) [16])*pauVar14 = auVar27;
                  pfVar10 = pfVar10 + 4;
                  pauVar14 = (undefined1 (*) [32])((long)*pauVar14 + 0x10);
                  uVar19 = uVar20 + 7;
                  uVar20 = uVar20 + 4;
                }
                if (uVar9 - uVar20 != 0 && (int)uVar20 <= (int)uVar9) {
                  lVar17 = 0;
                  do {
                    *(float *)((long)*pauVar14 + lVar17 * 4) =
                         *(float *)((long)*pauVar14 + lVar17 * 4) + pfVar10[lVar17];
                    lVar17 = lVar17 + 1;
                  } while (uVar9 - uVar20 != (int)lVar17);
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 != uVar21);
            }
            uVar8 = uVar8 + 1;
            pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar8 < (ulong)(((long)(bottom_blobs->
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar11
                                   >> 3) * -0x71c71c71c71c71c7));
        }
      }
      else {
        if (0 < (int)uVar3) {
          pp_Var4 = this->_vptr_Eltwise_x86_avx;
          uVar8 = 0;
          do {
            pfVar10 = (float *)(m->cstep * uVar8 * m->elemsize + (long)m->data);
            pfVar12 = (float *)(pMVar11[1].cstep * uVar8 * pMVar11[1].elemsize +
                               (long)pMVar11[1].data);
            pauVar14 = (undefined1 (*) [32])
                       (this_00->cstep * uVar8 * this_00->elemsize + (long)this_00->data);
            fVar1 = **(float **)(&this->field_0xd8 + (long)pp_Var4[-3]);
            auVar24._4_4_ = fVar1;
            auVar24._0_4_ = fVar1;
            auVar24._8_4_ = fVar1;
            auVar24._12_4_ = fVar1;
            fVar2 = (*(float **)(&this->field_0xd8 + (long)pp_Var4[-3]))[1];
            auVar30._4_4_ = fVar2;
            auVar30._0_4_ = fVar2;
            auVar30._8_4_ = fVar2;
            auVar30._12_4_ = fVar2;
            in_ZMM1 = ZEXT3264(CONCAT428(fVar2,CONCAT424(fVar2,CONCAT420(fVar2,CONCAT416(fVar2,
                                                  auVar30)))));
            if ((int)uVar9 < 8) {
              uVar20 = 0;
            }
            else {
              iVar16 = 7;
              auVar34 = in_ZMM3;
              do {
                auVar35._0_4_ = fVar2 * *pfVar12;
                auVar35._4_4_ = fVar2 * pfVar12[1];
                auVar35._8_4_ = fVar2 * pfVar12[2];
                auVar35._12_4_ = fVar2 * pfVar12[3];
                auVar35._16_4_ = fVar2 * pfVar12[4];
                auVar35._20_4_ = fVar2 * pfVar12[5];
                auVar35._28_36_ = auVar34._28_36_;
                auVar35._24_4_ = fVar2 * pfVar12[6];
                in_ZMM3 = ZEXT3264(auVar35._0_32_);
                auVar33._0_4_ = auVar35._0_4_ + fVar1 * *pfVar10;
                auVar33._4_4_ = auVar35._4_4_ + fVar1 * pfVar10[1];
                auVar33._8_4_ = auVar35._8_4_ + fVar1 * pfVar10[2];
                auVar33._12_4_ = auVar35._12_4_ + fVar1 * pfVar10[3];
                auVar33._16_4_ = auVar35._16_4_ + fVar1 * pfVar10[4];
                auVar33._20_4_ = auVar35._20_4_ + fVar1 * pfVar10[5];
                auVar33._24_4_ = auVar35._24_4_ + fVar1 * pfVar10[6];
                auVar33._28_4_ = auVar34._28_4_ + in_ZMM2._28_4_;
                in_ZMM2 = ZEXT3264(auVar33);
                *pauVar14 = auVar33;
                pfVar10 = pfVar10 + 8;
                pfVar12 = pfVar12 + 8;
                pauVar14 = pauVar14 + 1;
                iVar16 = iVar16 + 8;
                auVar34 = in_ZMM3;
                uVar20 = uVar9 & 0xfffffff8;
              } while (iVar16 < (int)uVar9);
            }
            if ((int)(uVar20 | 3) < (int)uVar9) {
              auVar22 = vshufps_avx(auVar24,auVar24,0);
              in_ZMM2 = ZEXT1664(auVar22);
              auVar23 = vshufps_avx(auVar30,auVar30,0);
              in_ZMM3 = ZEXT1664(auVar23);
              uVar19 = uVar20;
              do {
                auVar36._0_4_ = auVar23._0_4_ * *pfVar12 + auVar22._0_4_ * *pfVar10;
                auVar36._4_4_ = auVar23._4_4_ * pfVar12[1] + auVar22._4_4_ * pfVar10[1];
                auVar36._8_4_ = auVar23._8_4_ * pfVar12[2] + auVar22._8_4_ * pfVar10[2];
                auVar36._12_4_ = auVar23._12_4_ * pfVar12[3] + auVar22._12_4_ * pfVar10[3];
                *(undefined1 (*) [16])*pauVar14 = auVar36;
                pfVar10 = pfVar10 + 4;
                pfVar12 = pfVar12 + 4;
                pauVar14 = (undefined1 (*) [32])((long)*pauVar14 + 0x10);
                uVar20 = uVar19 + 4;
                iVar16 = uVar19 + 7;
                uVar19 = uVar20;
              } while (iVar16 < (int)uVar9);
            }
            if (uVar9 - uVar20 != 0 && (int)uVar20 <= (int)uVar9) {
              lVar17 = 0;
              do {
                in_ZMM3 = ZEXT464((uint)(fVar2 * pfVar12[lVar17]));
                fVar5 = fVar2 * pfVar12[lVar17] + fVar1 * pfVar10[lVar17];
                in_ZMM2 = ZEXT464((uint)fVar5);
                *(float *)((long)*pauVar14 + lVar17 * 4) = fVar5;
                lVar17 = lVar17 + 1;
              } while (uVar9 - uVar20 != (int)lVar17);
            }
            uVar8 = uVar8 + 1;
          } while (uVar8 != uVar21);
        }
        pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (2 < (ulong)(((long)(bottom_blobs->
                               super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                       -0x71c71c71c71c71c7)) {
          pp_Var4 = this->_vptr_Eltwise_x86_avx;
          uVar8 = 2;
          do {
            if (0 < (int)uVar3) {
              pMVar11 = pMVar11 + uVar8;
              uVar13 = 0;
              do {
                pfVar10 = (float *)(pMVar11->cstep * uVar13 * pMVar11->elemsize +
                                   (long)pMVar11->data);
                pauVar14 = (undefined1 (*) [32])
                           (this_00->cstep * uVar13 * this_00->elemsize + (long)this_00->data);
                fVar1 = *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var4[-3]) + uVar8 * 4);
                auVar25._4_4_ = fVar1;
                auVar25._0_4_ = fVar1;
                auVar25._8_4_ = fVar1;
                auVar25._12_4_ = fVar1;
                uVar20 = 0;
                if (7 < (int)uVar9) {
                  iVar16 = 7;
                  do {
                    auVar31._0_4_ = fVar1 * *pfVar10 + *(float *)*pauVar14;
                    auVar31._4_4_ = fVar1 * pfVar10[1] + *(float *)((long)*pauVar14 + 4);
                    auVar31._8_4_ = fVar1 * pfVar10[2] + *(float *)((long)*pauVar14 + 8);
                    auVar31._12_4_ = fVar1 * pfVar10[3] + *(float *)((long)*pauVar14 + 0xc);
                    auVar31._16_4_ = fVar1 * pfVar10[4] + *(float *)((long)*pauVar14 + 0x10);
                    auVar31._20_4_ = fVar1 * pfVar10[5] + *(float *)((long)*pauVar14 + 0x14);
                    auVar31._24_4_ = fVar1 * pfVar10[6] + *(float *)((long)*pauVar14 + 0x18);
                    auVar31._28_4_ = in_ZMM1._28_4_ + *(float *)((long)*pauVar14 + 0x1c);
                    in_ZMM1 = ZEXT3264(auVar31);
                    *pauVar14 = auVar31;
                    pfVar10 = pfVar10 + 8;
                    pauVar14 = pauVar14 + 1;
                    iVar16 = iVar16 + 8;
                    uVar20 = uVar9 & 0xfffffff8;
                  } while (iVar16 < (int)uVar9);
                }
                if ((int)(uVar20 | 3) < (int)uVar9) {
                  auVar22 = vshufps_avx(auVar25,auVar25,0);
                  in_ZMM1 = ZEXT1664(auVar22);
                  uVar19 = uVar20;
                  do {
                    auVar32._0_4_ = auVar22._0_4_ * *pfVar10 + *(float *)*pauVar14;
                    auVar32._4_4_ = auVar22._4_4_ * pfVar10[1] + *(float *)((long)*pauVar14 + 4);
                    auVar32._8_4_ = auVar22._8_4_ * pfVar10[2] + *(float *)((long)*pauVar14 + 8);
                    auVar32._12_4_ = auVar22._12_4_ * pfVar10[3] + *(float *)((long)*pauVar14 + 0xc)
                    ;
                    *(undefined1 (*) [16])*pauVar14 = auVar32;
                    pfVar10 = pfVar10 + 4;
                    pauVar14 = (undefined1 (*) [32])((long)*pauVar14 + 0x10);
                    uVar20 = uVar19 + 4;
                    iVar16 = uVar19 + 7;
                    uVar19 = uVar20;
                  } while (iVar16 < (int)uVar9);
                }
                if (uVar9 - uVar20 != 0 && (int)uVar20 <= (int)uVar9) {
                  lVar17 = 0;
                  do {
                    fVar2 = fVar1 * pfVar10[lVar17] + *(float *)((long)*pauVar14 + lVar17 * 4);
                    in_ZMM1 = ZEXT464((uint)fVar2);
                    *(float *)((long)*pauVar14 + lVar17 * 4) = fVar2;
                    lVar17 = lVar17 + 1;
                  } while (uVar9 - uVar20 != (int)lVar17);
                }
                uVar13 = uVar13 + 1;
              } while (uVar13 != uVar21);
            }
            uVar8 = uVar8 + 1;
            pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          } while (uVar8 < (ulong)(((long)(bottom_blobs->
                                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar11
                                   >> 3) * -0x71c71c71c71c71c7));
        }
      }
    }
    iVar16 = 0;
    if (*(int *)(&this->field_0xd0 + (long)this->_vptr_Eltwise_x86_avx[-3]) == 2) {
      if (0 < (int)uVar3) {
        pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        uVar8 = 0;
        do {
          pauVar14 = (undefined1 (*) [32])(m->cstep * uVar8 * m->elemsize + (long)m->data);
          pauVar15 = (undefined1 (*) [32])
                     (pMVar11[1].cstep * uVar8 * pMVar11[1].elemsize + (long)pMVar11[1].data);
          pauVar18 = (undefined1 (*) [32])
                     (this_00->cstep * uVar8 * this_00->elemsize + (long)this_00->data);
          if ((int)uVar9 < 8) {
            uVar20 = 0;
          }
          else {
            iVar16 = 7;
            do {
              auVar6 = vmaxps_avx(*pauVar14,*pauVar15);
              *pauVar18 = auVar6;
              pauVar14 = pauVar14 + 1;
              pauVar15 = pauVar15 + 1;
              pauVar18 = pauVar18 + 1;
              iVar16 = iVar16 + 8;
              uVar20 = uVar9 & 0xfffffff8;
            } while (iVar16 < (int)uVar9);
          }
          uVar19 = uVar20 | 3;
          while ((int)uVar19 < (int)uVar9) {
            auVar22 = vmaxps_avx(*(undefined1 (*) [16])*pauVar14,*(undefined1 (*) [16])*pauVar15);
            *(undefined1 (*) [16])*pauVar18 = auVar22;
            pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
            pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
            pauVar18 = (undefined1 (*) [32])((long)*pauVar18 + 0x10);
            uVar19 = uVar20 + 7;
            uVar20 = uVar20 + 4;
          }
          if (uVar9 - uVar20 != 0 && (int)uVar20 <= (int)uVar9) {
            lVar17 = 0;
            do {
              auVar22 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar15 + lVar17 * 4)),
                                   ZEXT416(*(uint *)(*pauVar14 + lVar17 * 4)));
              *(int *)((long)*pauVar18 + lVar17 * 4) = auVar22._0_4_;
              lVar17 = lVar17 + 1;
            } while (uVar9 - uVar20 != (int)lVar17);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar21);
      }
      pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar16 = 0;
      if (2 < (ulong)(((long)(bottom_blobs->
                             super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)pMVar11 >> 3) *
                     -0x71c71c71c71c71c7)) {
        uVar8 = 2;
        do {
          if (0 < (int)uVar3) {
            pMVar11 = pMVar11 + uVar8;
            uVar13 = 0;
            do {
              pauVar14 = (undefined1 (*) [32])
                         (pMVar11->cstep * uVar13 * pMVar11->elemsize + (long)pMVar11->data);
              pauVar15 = (undefined1 (*) [32])
                         (this_00->cstep * uVar13 * this_00->elemsize + (long)this_00->data);
              uVar20 = 0;
              if (7 < (int)uVar9) {
                iVar16 = 7;
                do {
                  auVar6 = vmaxps_avx(*pauVar15,*pauVar14);
                  *pauVar15 = auVar6;
                  pauVar14 = pauVar14 + 1;
                  pauVar15 = pauVar15 + 1;
                  iVar16 = iVar16 + 8;
                  uVar20 = uVar9 & 0xfffffff8;
                } while (iVar16 < (int)uVar9);
              }
              uVar19 = uVar20 | 3;
              while ((int)uVar19 < (int)uVar9) {
                auVar22 = vmaxps_avx(*(undefined1 (*) [16])*pauVar15,*(undefined1 (*) [16])*pauVar14
                                    );
                *(undefined1 (*) [16])*pauVar15 = auVar22;
                pauVar14 = (undefined1 (*) [32])(*pauVar14 + 0x10);
                pauVar15 = (undefined1 (*) [32])(*pauVar15 + 0x10);
                uVar19 = uVar20 + 7;
                uVar20 = uVar20 + 4;
              }
              if (uVar9 - uVar20 != 0 && (int)uVar20 <= (int)uVar9) {
                lVar17 = 0;
                do {
                  auVar22 = vmaxss_avx(ZEXT416(*(uint *)(*pauVar15 + lVar17 * 4)),
                                       ZEXT416(*(uint *)(*pauVar14 + lVar17 * 4)));
                  *(int *)(*pauVar15 + lVar17 * 4) = auVar22._0_4_;
                  lVar17 = lVar17 + 1;
                } while (uVar9 - uVar20 != (int)lVar17);
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 != uVar21);
          }
          uVar8 = uVar8 + 1;
          pMVar11 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        } while (uVar8 < (ulong)(((long)(bottom_blobs->
                                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar11 >>
                                 3) * -0x71c71c71c71c71c7));
        iVar16 = 0;
      }
    }
  }
  return iVar16;
}

Assistant:

int Eltwise_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h * elempack;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_mul_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_mul_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_mul_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_mul_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_add_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_add_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_add_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_add_ps(_p, _p1);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                const float coeff0 = coeffs[0];
                const float coeff1 = coeffs[1];

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                __m512 _coeff0_avx512 = _mm512_set1_ps(coeff0);
                __m512 _coeff1_avx512 = _mm512_set1_ps(coeff1);
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(ptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr1);
                    _p = _mm512_mul_ps(_p, _coeff0_avx512);
                    _p = _mm512_fmadd_ps(_p1, _coeff1_avx512, _p);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    ptr1 += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                __m256 _coeff0_avx = _mm256_set1_ps(coeff0);
                __m256 _coeff1_avx = _mm256_set1_ps(coeff1);
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _coeff0_avx);
                    _p = _mm256_comp_fmadd_ps(_p1, _coeff1_avx, _p);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
#endif // __AVX__
                __m128 _coeff0 = _mm_set1_ps(coeff0);
                __m128 _coeff1 = _mm_set1_ps(coeff1);
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _coeff0);
                    _p1 = _mm_mul_ps(_p1, _coeff1);
                    _p = _mm_add_ps(_p1, _p);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    const float coeff = coeffs[b];

                    int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                    __m512 _coeff_avx512 = _mm512_set1_ps(coeff);
                    for (; i + 15 < size; i += 16)
                    {
                        __m512 _p = _mm512_loadu_ps(outptr);
                        __m512 _p1 = _mm512_loadu_ps(ptr);
                        _p = _mm512_fmadd_ps(_p1, _coeff_avx512, _p);
                        _mm512_storeu_ps(outptr, _p);

                        ptr += 16;
                        outptr += 16;
                    }
#endif // __AVX512F__
                    __m256 _coeff_avx = _mm256_set1_ps(coeff);
                    for (; i + 7 < size; i += 8)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff_avx, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
#endif // __AVX__
                    __m128 _coeff = _mm_set1_ps(coeff);
                    for (; i + 3 < size; i += 4)
                    {
                        __m128 _p1 = _mm_load_ps(ptr);
                        __m128 _p = _mm_load_ps(outptr);
                        _p1 = _mm_mul_ps(_p1, _coeff);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
#endif // __SSE2__
                    for (; i < size; i++)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            for (; i + 15 < size; i += 16)
            {
                __m512 _p = _mm512_loadu_ps(ptr);
                __m512 _p1 = _mm512_loadu_ps(ptr1);
                _p = _mm512_max_ps(_p, _p1);
                _mm512_storeu_ps(outptr, _p);

                ptr += 16;
                ptr1 += 16;
                outptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                __m256 _p1 = _mm256_loadu_ps(ptr1);
                _p = _mm256_max_ps(_p, _p1);
                _mm256_storeu_ps(outptr, _p);

                ptr += 8;
                ptr1 += 8;
                outptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p = _mm_load_ps(ptr);
                __m128 _p1 = _mm_load_ps(ptr1);
                _p = _mm_max_ps(_p, _p1);
                _mm_store_ps(outptr, _p);

                ptr += 4;
                ptr1 += 4;
                outptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
                for (; i + 15 < size; i += 16)
                {
                    __m512 _p = _mm512_loadu_ps(outptr);
                    __m512 _p1 = _mm512_loadu_ps(ptr);
                    _p = _mm512_max_ps(_p, _p1);
                    _mm512_storeu_ps(outptr, _p);

                    ptr += 16;
                    outptr += 16;
                }
#endif // __AVX512F__
                for (; i + 7 < size; i += 8)
                {
                    __m256 _p = _mm256_loadu_ps(outptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    outptr += 8;
                }
#endif // __AVX__
                for (; i + 3 < size; i += 4)
                {
                    __m128 _p = _mm_load_ps(outptr);
                    __m128 _p1 = _mm_load_ps(ptr);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    outptr += 4;
                }
#endif // __SSE2__
                for (; i < size; i++)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}